

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O0

void fft_execute(fft_plan p)

{
  fft_plan p_00;
  fft_plan p_01;
  int in_stack_0000000c;
  double *__src;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined1 local_50 [8];
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined8 local_10;
  
  __src = (double *)&stack0x00000008;
  if (in_stack_0000000c == 1) {
    memcpy(local_50,__src,0x48);
    p_00._8_8_ = local_40;
    p_00.n = (undefined4)uStack_48;
    p_00.sign = uStack_48._4_4_;
    p_00.c_in = (fft_complex *)uStack_38;
    p_00.in = (double *)local_30;
    p_00.c_out = (fft_complex *)uStack_28;
    p_00.out = (double *)local_20;
    p_00.input = (double *)uStack_18;
    p_00.ip = (int *)local_10;
    p_00.w = __src;
    anon_unknown.dwarf_3445::ForwardFFT(p_00);
  }
  else {
    memcpy(local_98,__src,0x48);
    p_01._8_8_ = local_88;
    p_01.n = (undefined4)uStack_90;
    p_01.sign = uStack_90._4_4_;
    p_01.c_in = (fft_complex *)uStack_80;
    p_01.in = (double *)local_78;
    p_01.c_out = (fft_complex *)uStack_70;
    p_01.out = (double *)local_68;
    p_01.input = (double *)uStack_60;
    p_01.ip = (int *)local_58;
    p_01.w = __src;
    anon_unknown.dwarf_3445::BackwardFFT(p_01);
  }
  return;
}

Assistant:

void fft_execute(fft_plan p) {
  if (p.sign == FFT_FORWARD) {
    ForwardFFT(p);
  } else {  // ifft
    BackwardFFT(p);
  }
}